

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O2

void __thiscall
TasGrid::TasmanianSparseGrid::getDifferentiationWeights
          (TasmanianSparseGrid *this,double *x,double *weights)

{
  BaseCanonicalGrid *pBVar1;
  uint uVar2;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  vector<double,_std::allocator<double>_> jacobian_g_diag;
  Data2D<double> x_tmp;
  
  x_tmp.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  x_tmp.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  x_tmp.stride = 0;
  x_tmp.num_strips = 0;
  x_tmp.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pBVar1 = (this->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  pdVar3 = formCanonicalPoints<double>(this,x,&x_tmp,1);
  (*pBVar1->_vptr_BaseCanonicalGrid[0xe])(pBVar1,pdVar3,weights);
  if ((this->domain_transform_a).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->domain_transform_a).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pBVar1 = (this->base)._M_t.
             super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
             ._M_t.
             super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
             .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
    if (pBVar1 == (BaseCanonicalGrid *)0x0) {
      uVar6 = 0;
    }
    else {
      uVar6 = pBVar1->num_dimensions;
    }
    uVar2 = getNumPoints(this);
    diffCanonicalTransform<double>(&jacobian_g_diag,this);
    uVar4 = 0;
    uVar5 = 0;
    if (0 < (int)uVar6) {
      uVar5 = (ulong)uVar6;
    }
    uVar8 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar8 = uVar4;
    }
    for (; uVar4 != uVar8; uVar4 = uVar4 + 1) {
      for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
        weights[uVar7] =
             weights[uVar7] *
             jacobian_g_diag.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7];
      }
      weights = weights + (int)uVar6;
    }
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&jacobian_g_diag.super__Vector_base<double,_std::allocator<double>_>);
  }
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&x_tmp.vec.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void TasmanianSparseGrid::getDifferentiationWeights(const double x[], double weights[]) const{
    // See differentiate() for how the domain transforms are taken into consideration.
    Data2D<double> x_tmp;
    // Jacobian of f(.) at g(x).
    base->getDifferentiationWeights(formCanonicalPoints(x, x_tmp, 1), weights);
    // Jacobian of f(g(.)) at x.
    if (not domain_transform_a.empty()) {
        int num_dimensions = getNumDimensions();
        int num_points = getNumPoints();
        std::vector<double> jacobian_g_diag = diffCanonicalTransform<double>();
        for(int i=0; i<num_points; i++)
            for(int j=0; j<num_dimensions; j++)
                weights[i * num_dimensions + j] = weights[i * num_dimensions + j] * jacobian_g_diag[j];
    }
}